

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

bool_t prf_header_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  ushort uVar1;
  uint uVar2;
  uint len;
  bool_t bVar3;
  
  if (node->opcode == prf_header_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar1 = node->length;
    if (uVar1 < 0xc) {
      uVar2 = 4;
    }
    else {
      buffer = node->data;
      bf_write(bfile,buffer,8);
      uVar1 = node->length;
      if (uVar1 < 0x10) {
        uVar2 = 0xc;
      }
      else {
        bf_put_int32_be(bfile,*(int32_t *)(buffer + 8));
        uVar1 = node->length;
        if (uVar1 < 0x14) {
          uVar2 = 0x10;
        }
        else {
          bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xc));
          uVar1 = node->length;
          if (uVar1 < 0x34) {
            uVar2 = 0x14;
          }
          else {
            bf_write(bfile,buffer + 0x10,0x20);
            uVar1 = node->length;
            if (uVar1 < 0x36) {
              uVar2 = 0x34;
            }
            else {
              bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x30));
              uVar1 = node->length;
              if (uVar1 < 0x38) {
                uVar2 = 0x36;
              }
              else {
                bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x32));
                uVar1 = node->length;
                if (uVar1 < 0x3a) {
                  uVar2 = 0x38;
                }
                else {
                  bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x34));
                  uVar1 = node->length;
                  if (uVar1 < 0x3c) {
                    uVar2 = 0x3a;
                  }
                  else {
                    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x36));
                    uVar1 = node->length;
                    if (uVar1 < 0x3e) {
                      uVar2 = 0x3c;
                    }
                    else {
                      bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x38));
                      uVar1 = node->length;
                      if (uVar1 < 0x3f) {
                        uVar2 = 0x3e;
                      }
                      else {
                        bf_put_int8(bfile,buffer[0x3a]);
                        uVar1 = node->length;
                        if (uVar1 < 0x40) {
                          uVar2 = 0x3f;
                        }
                        else {
                          bf_put_int8(bfile,buffer[0x3b]);
                          uVar1 = node->length;
                          if (uVar1 < 0x44) {
                            uVar2 = 0x40;
                          }
                          else {
                            bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x3c));
                            uVar1 = node->length;
                            if (uVar1 < 0x48) {
                              uVar2 = 0x44;
                            }
                            else {
                              bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x40));
                              uVar1 = node->length;
                              if (uVar1 < 0x4c) {
                                uVar2 = 0x48;
                              }
                              else {
                                bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x44));
                                uVar1 = node->length;
                                if (uVar1 < 0x50) {
                                  uVar2 = 0x4c;
                                }
                                else {
                                  bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x48));
                                  uVar1 = node->length;
                                  if (uVar1 < 0x54) {
                                    uVar2 = 0x50;
                                  }
                                  else {
                                    bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x4c));
                                    uVar1 = node->length;
                                    if (uVar1 < 0x58) {
                                      uVar2 = 0x54;
                                    }
                                    else {
                                      bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x50));
                                      uVar1 = node->length;
                                      if (uVar1 < 0x5c) {
                                        uVar2 = 0x58;
                                      }
                                      else {
                                        bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x54));
                                        uVar1 = node->length;
                                        if (uVar1 < 0x60) {
                                          uVar2 = 0x5c;
                                        }
                                        else {
                                          bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x58));
                                          uVar1 = node->length;
                                          if (uVar1 < 100) {
                                            uVar2 = 0x60;
                                          }
                                          else {
                                            bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x5c));
                                            uVar1 = node->length;
                                            if (uVar1 < 0x68) {
                                              uVar2 = 100;
                                            }
                                            else {
                                              bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x60));
                                              uVar1 = node->length;
                                              if (uVar1 < 0x6c) {
                                                uVar2 = 0x68;
                                              }
                                              else {
                                                bf_put_int32_be(bfile,*(int32_t *)(buffer + 100));
                                                uVar1 = node->length;
                                                if (uVar1 < 0x70) {
                                                  uVar2 = 0x6c;
                                                }
                                                else {
                                                  bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x68))
                                                  ;
                                                  uVar1 = node->length;
                                                  if (uVar1 < 0x74) {
                                                    uVar2 = 0x70;
                                                  }
                                                  else {
                                                    bf_put_int32_be(bfile,*(int32_t *)
                                                                           (buffer + 0x6c));
                                                    uVar1 = node->length;
                                                    if (uVar1 < 0x78) {
                                                      uVar2 = 0x74;
                                                    }
                                                    else {
                                                      bf_put_int32_be(bfile,*(int32_t *)
                                                                             (buffer + 0x70));
                                                      uVar1 = node->length;
                                                      if (uVar1 < 0x7c) {
                                                        uVar2 = 0x78;
                                                      }
                                                      else {
                                                        bf_put_int32_be(bfile,*(int32_t *)
                                                                               (buffer + 0x74));
                                                        uVar1 = node->length;
                                                        if (uVar1 < 0x7e) {
                                                          uVar2 = 0x7c;
                                                        }
                                                        else {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0x78));
                                                          uVar1 = node->length;
                                                          if (uVar1 < 0x80) {
                                                            uVar2 = 0x7e;
                                                          }
                                                          else {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0x7a));
                                                            uVar1 = node->length;
                                                            uVar2 = 0x80;
                                                            if (0x83 < uVar1) {
                                                              bf_put_int32_be(bfile,*(int32_t *)
                                                                                     (buffer + 0x7c)
                                                                             );
                                                              uVar1 = node->length;
                                                              uVar2 = 0x84;
                                                              if (0x8b < uVar1) {
                                                                bf_put_float64_be(bfile,*(float64_t 
                                                  *)(buffer + 0x80));
                                                  uVar1 = node->length;
                                                  uVar2 = 0x8c;
                                                  if (0x93 < uVar1) {
                                                    bf_put_float64_be(bfile,*(float64_t *)
                                                                             (buffer + 0x88));
                                                    uVar1 = node->length;
                                                    uVar2 = 0x94;
                                                    if (0x9b < uVar1) {
                                                      bf_put_float64_be(bfile,*(float64_t *)
                                                                               (buffer + 0x90));
                                                      uVar1 = node->length;
                                                      uVar2 = 0x9c;
                                                      if (0xa3 < uVar1) {
                                                        bf_put_float64_be(bfile,*(float64_t *)
                                                                                 (buffer + 0x98));
                                                        uVar1 = node->length;
                                                        uVar2 = 0xa4;
                                                        if (0xa5 < uVar1) {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0xa0));
                                                          uVar1 = node->length;
                                                          uVar2 = 0xa6;
                                                          if (0xa7 < uVar1) {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0xa2));
                                                            uVar1 = node->length;
                                                            uVar2 = 0xa8;
                                                            if (0xab < uVar1) {
                                                              bf_put_int32_be(bfile,*(int32_t *)
                                                                                     (buffer + 0xa4)
                                                                             );
                                                              uVar1 = node->length;
                                                              uVar2 = 0xac;
                                                              if (0xaf < uVar1) {
                                                                bf_put_int32_be(bfile,*(int32_t *)
                                                                                       (buffer + 
                                                  0xa8));
                                                  uVar1 = node->length;
                                                  uVar2 = 0xb0;
                                                  if (0xb1 < uVar1) {
                                                    bf_put_int16_be(bfile,*(int16_t *)
                                                                           (buffer + 0xac));
                                                    uVar1 = node->length;
                                                    uVar2 = 0xb2;
                                                    if (0xb3 < uVar1) {
                                                      bf_put_int16_be(bfile,*(int16_t *)
                                                                             (buffer + 0xae));
                                                      uVar1 = node->length;
                                                      uVar2 = 0xb4;
                                                      if (0xb5 < uVar1) {
                                                        bf_put_int16_be(bfile,*(int16_t *)
                                                                               (buffer + 0xb0));
                                                        uVar1 = node->length;
                                                        uVar2 = 0xb6;
                                                        if (0xb7 < uVar1) {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0xb2));
                                                          uVar1 = node->length;
                                                          uVar2 = 0xb8;
                                                          if (0xbb < uVar1) {
                                                            bf_put_int32_be(bfile,*(int32_t *)
                                                                                   (buffer + 0xb4));
                                                            uVar1 = node->length;
                                                            uVar2 = 0xbc;
                                                            if (0xc3 < uVar1) {
                                                              bf_put_float64_be(bfile,*(float64_t *)
                                                                                       (buffer + 
                                                  0xb8));
                                                  uVar1 = node->length;
                                                  uVar2 = 0xc4;
                                                  if (0xcb < uVar1) {
                                                    bf_put_float64_be(bfile,*(float64_t *)
                                                                             (buffer + 0xc0));
                                                    uVar1 = node->length;
                                                    uVar2 = 0xcc;
                                                    if (0xd3 < uVar1) {
                                                      bf_put_float64_be(bfile,*(float64_t *)
                                                                               (buffer + 200));
                                                      uVar1 = node->length;
                                                      uVar2 = 0xd4;
                                                      if (0xdb < uVar1) {
                                                        bf_put_float64_be(bfile,*(float64_t *)
                                                                                 (buffer + 0xd0));
                                                        uVar1 = node->length;
                                                        uVar2 = 0xdc;
                                                        if (0xe3 < uVar1) {
                                                          bf_put_float64_be(bfile,*(float64_t *)
                                                                                   (buffer + 0xd8));
                                                          uVar1 = node->length;
                                                          uVar2 = 0xe4;
                                                          if (0xeb < uVar1) {
                                                            bf_put_float64_be(bfile,*(float64_t *)
                                                                                     (buffer + 0xe0)
                                                                             );
                                                            uVar1 = node->length;
                                                            uVar2 = 0xec;
                                                            if (0xf3 < uVar1) {
                                                              bf_put_float64_be(bfile,*(float64_t *)
                                                                                       (buffer + 
                                                  0xe8));
                                                  uVar1 = node->length;
                                                  uVar2 = 0xf4;
                                                  if (0xfb < uVar1) {
                                                    bf_put_float64_be(bfile,*(float64_t *)
                                                                             (buffer + 0xf0));
                                                    uVar1 = node->length;
                                                    uVar2 = 0xfc;
                                                    if (0xfd < uVar1) {
                                                      bf_put_int16_be(bfile,*(int16_t *)
                                                                             (buffer + 0xf8));
                                                      uVar1 = node->length;
                                                      uVar2 = 0xfe;
                                                      if (0xff < uVar1) {
                                                        bf_put_int16_be(bfile,*(int16_t *)
                                                                               (buffer + 0xfa));
                                                        uVar1 = node->length;
                                                        uVar2 = 0x100;
                                                        if (0x101 < uVar1) {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0xfc));
                                                          uVar1 = node->length;
                                                          uVar2 = 0x102;
                                                          if (0x103 < uVar1) {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0xfe));
                                                            uVar1 = node->length;
                                                            uVar2 = 0x104;
                                                            if (0x105 < uVar1) {
                                                              bf_put_int16_be(bfile,*(int16_t *)
                                                                                     (buffer + 0x100
                                                                                     ));
                                                              uVar1 = node->length;
                                                              uVar2 = 0x106;
                                                              if (0x107 < uVar1) {
                                                                bf_put_int16_be(bfile,*(int16_t *)
                                                                                       (buffer + 
                                                  0x102));
                                                  uVar1 = node->length;
                                                  uVar2 = 0x108;
                                                  if (0x109 < uVar1) {
                                                    bf_put_int16_be(bfile,*(int16_t *)
                                                                           (buffer + 0x104));
                                                    uVar1 = node->length;
                                                    uVar2 = 0x10a;
                                                    if (0x10b < uVar1) {
                                                      bf_put_int16_be(bfile,*(int16_t *)
                                                                             (buffer + 0x106));
                                                      uVar1 = node->length;
                                                      uVar2 = 0x10c;
                                                      if (0x10f < uVar1) {
                                                        bf_put_int32_be(bfile,*(int32_t *)
                                                                               (buffer + 0x108));
                                                        uVar1 = node->length;
                                                        uVar2 = 0x110;
                                                        if (0x111 < uVar1) {
                                                          bf_put_int16_be(bfile,*(int16_t *)
                                                                                 (buffer + 0x10c));
                                                          uVar1 = node->length;
                                                          uVar2 = 0x112;
                                                          if (0x113 < uVar1) {
                                                            bf_put_int16_be(bfile,*(int16_t *)
                                                                                   (buffer + 0x10e))
                                                            ;
                                                            uVar1 = node->length;
                                                            uVar2 = 0x114;
                                                            if (0x115 < uVar1) {
                                                              bf_put_int16_be(bfile,*(int16_t *)
                                                                                     (buffer + 0x110
                                                                                     ));
                                                              uVar1 = node->length;
                                                              uVar2 = 0x116;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar3 = 1;
    len = uVar1 - uVar2;
    if (uVar2 <= uVar1 && len != 0) {
      bf_write(bfile,node->data + (ulong)uVar2 + 2,len);
    }
  }
  else {
    bVar3 = 0;
    prf_error(9,"tried header save method on node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_header_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "tried header save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 8) ) break;
        bf_write( bfile, (uint8_t *) data->id, 8 ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->format_revision_level ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->edit_revision_level ); pos += 4;
        if ( node->length < (pos + 32) ) break;
        bf_write( bfile, (uint8_t *) data->date_and_time, 32 ); pos += 32;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_group ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_lod ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_object ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_face ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->unit_multiplier_divisor ); pos += 2;
        if ( node->length < (pos + 1) ) break;
        bf_put_int8( bfile, data->vertex_coordinate_units ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        bf_put_int8( bfile, data->texwhite ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[3] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[4] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[5] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->projection_type ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[3] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[4] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[5] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[6] ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_dof ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->vertex_storage_type ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->database_origin ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_database_x ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_database_y ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->delta_x ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->delta_y ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_sound ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_path ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3[1] ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_clip ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_text ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_bsp ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_switch ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved4 ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_corner_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_corner_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->northeast_corner_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->northeast_corner_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->origin_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->origin_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->lambert_upper_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->lambert_lower_latitude ) );
            pos += 8;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_light_source ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_light_point ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_road ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_cat ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved5 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved6 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved7 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved8 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->earth_ellipsoid_model ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_adaptive ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_curve ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved9 ); pos += 2;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}